

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenChain.h
# Opt level: O1

void __thiscall adios2::shm::TokenChain<unsigned_long>::~TokenChain(TokenChain<unsigned_long> *this)

{
  _Alloc_hider _Var1;
  string local_30;
  
  if (this->m_nProc < 2) {
    _Var1._M_p = (pointer)this->m_Shm;
    if ((segment_ *)_Var1._M_p == (segment_ *)0x0) goto LAB_0048a1fa;
  }
  else {
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    helper::Comm::Win_free(this->m_NodeComm,&this->m_Win,&local_30);
    _Var1._M_p = local_30._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) goto LAB_0048a1fa;
  }
  operator_delete(_Var1._M_p);
LAB_0048a1fa:
  helper::Comm::Win::~Win(&this->m_Win);
  return;
}

Assistant:

~TokenChain()
    {
        if (m_nProc > 1)
        {
            m_NodeComm->Win_free(m_Win);
        }
        else
        {
            delete m_Shm;
        }
    }